

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O0

void unlink_lnksymbol(GlobalVars *gv,Symbol *sym)

{
  long lVar1;
  unsigned_long uVar2;
  long in_RSI;
  long in_RDI;
  Symbol **chain;
  Symbol *cptr;
  long *local_20;
  
  if (*(long *)(in_RDI + 0x1a0) == 0) {
    ierror("%slnksyms==NULL",unlink_lnksymbol::fn);
  }
  else {
    lVar1 = *(long *)(in_RDI + 0x1a0);
    uVar2 = elf_hash(*(char **)(in_RSI + 0x20));
    local_20 = (long *)(lVar1 + (uVar2 & 0xf) * 8);
    while ((lVar1 = *local_20, lVar1 != 0 && (lVar1 != in_RSI))) {
      local_20 = (long *)(lVar1 + 0x18);
    }
    if (lVar1 == 0) {
      ierror("%s%s could not be found in linker-symbols list",unlink_lnksymbol::fn,
             *(undefined8 *)(in_RSI + 0x20));
    }
    else {
      *local_20 = *(long *)(in_RSI + 0x18);
      *(undefined8 *)(in_RSI + 0x18) = 0;
    }
  }
  return;
}

Assistant:

static void unlink_lnksymbol(struct GlobalVars *gv,struct Symbol *sym)
/* remove a linker-symbol from its list */
{
  static const char *fn = "unlink_lnksymbol(): ";

  if (gv->lnksyms) {
    struct Symbol *cptr;
    struct Symbol **chain = &gv->lnksyms[elf_hash(sym->name)%LNKSYMHTABSIZE];

    while (cptr = *chain) {
      if (cptr == sym)
        break;
      chain = &cptr->obj_chain;
    }
    if (cptr) {
      /* delete the symbol node from the chain */
      *chain = sym->obj_chain;
      sym->obj_chain = NULL;
    }
    else
      ierror("%s%s could not be found in linker-symbols list",fn,sym->name);
  }
  else
    ierror("%slnksyms==NULL",fn);
}